

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_register_driver
              (char *prefix,_func_int *init,_func_int *shutdown,_func_int_int *setoptions,
              _func_int_int_ptr *getoptions,_func_int_int_ptr *getversion,
              _func_int_char_ptr_char_ptr_char_ptr *checkfile,_func_int_char_ptr_int_int_ptr *open,
              _func_int_char_ptr_int_ptr *create,_func_int_int_LONGLONG *truncate,
              _func_int_int *close,_func_int_char_ptr *fremove,_func_int_int_LONGLONG_ptr *size,
              _func_int_int *flush,_func_int_int_LONGLONG *seek,_func_int_int_void_ptr_long *read,
              _func_int_int_void_ptr_long *write)

{
  int iVar1;
  long lVar2;
  
  if (no_of_drivers < 0) {
    ffpmsg("Vital CFITSIO parameters held in memory have been corrupted!!");
    ffpmsg("Fatal condition detected in fits_register_driver.");
    iVar1 = 0x7a;
  }
  else {
    iVar1 = 0x7a;
    if ((uint)no_of_drivers < 0x1f) {
      if (prefix == (char *)0x0) {
        iVar1 = 0x79;
      }
      else if ((init == (_func_int *)0x0) || (iVar1 = (*init)(), iVar1 == 0)) {
        iVar1 = no_of_drivers;
        lVar2 = (long)no_of_drivers;
        strncpy(driverTable[lVar2].prefix,prefix,0x14);
        driverTable[lVar2].prefix[0x13] = '\0';
        driverTable[lVar2].init = init;
        driverTable[lVar2].shutdown = shutdown;
        driverTable[lVar2].setoptions = setoptions;
        driverTable[lVar2].getoptions = getoptions;
        driverTable[lVar2].getversion = getversion;
        driverTable[lVar2].checkfile = checkfile;
        driverTable[lVar2].open = open;
        driverTable[lVar2].create = create;
        driverTable[lVar2].truncate = truncate;
        driverTable[lVar2].close = close;
        driverTable[lVar2].remove = fremove;
        driverTable[lVar2].size = size;
        driverTable[lVar2].flush = flush;
        driverTable[lVar2].seek = seek;
        driverTable[lVar2].read = read;
        driverTable[lVar2].write = write;
        no_of_drivers = iVar1 + 1;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int fits_register_driver(char *prefix,
	int (*init)(void),
	int (*shutdown)(void),
	int (*setoptions)(int option),
	int (*getoptions)(int *options),
	int (*getversion)(int *version),
	int (*checkfile) (char *urltype, char *infile, char *outfile),
	int (*open)(char *filename, int rwmode, int *driverhandle),
	int (*create)(char *filename, int *driverhandle),
	int (*truncate)(int driverhandle, LONGLONG filesize),
	int (*close)(int driverhandle),
	int (*fremove)(char *filename),
        int (*size)(int driverhandle, LONGLONG *sizex),
	int (*flush)(int driverhandle),
	int (*seek)(int driverhandle, LONGLONG offset),
	int (*read) (int driverhandle, void *buffer, long nbytes),
	int (*write)(int driverhandle, void *buffer, long nbytes) )
/*
  register all the functions needed to support an I/O driver
*/
{
    int status;
 
    if (no_of_drivers < 0 ) {
	  /* This is bad. looks like memory has been corrupted. */
	  ffpmsg("Vital CFITSIO parameters held in memory have been corrupted!!");
	  ffpmsg("Fatal condition detected in fits_register_driver.");
	  return(TOO_MANY_DRIVERS);
    }

    if (no_of_drivers + 1 > MAX_DRIVERS)
        return(TOO_MANY_DRIVERS);

    if (prefix  == NULL)
        return(BAD_URL_PREFIX);
   

    if (init != NULL)		
    { 
        status = (*init)();  /* initialize the driver */
        if (status)
            return(status);
    }

    	/*  fill in data in table */
    strncpy(driverTable[no_of_drivers].prefix, prefix, MAX_PREFIX_LEN);
    driverTable[no_of_drivers].prefix[MAX_PREFIX_LEN - 1] = 0;
    driverTable[no_of_drivers].init = init;
    driverTable[no_of_drivers].shutdown = shutdown;
    driverTable[no_of_drivers].setoptions = setoptions;
    driverTable[no_of_drivers].getoptions = getoptions;
    driverTable[no_of_drivers].getversion = getversion;
    driverTable[no_of_drivers].checkfile = checkfile;
    driverTable[no_of_drivers].open = open;
    driverTable[no_of_drivers].create = create;
    driverTable[no_of_drivers].truncate = truncate;
    driverTable[no_of_drivers].close = close;
    driverTable[no_of_drivers].remove = fremove;
    driverTable[no_of_drivers].size = size;
    driverTable[no_of_drivers].flush = flush;
    driverTable[no_of_drivers].seek = seek;
    driverTable[no_of_drivers].read = read;
    driverTable[no_of_drivers].write = write;

    no_of_drivers++;      /* increment the number of drivers */
    return(0);
 }